

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

mbedtls_pk_type_t mbedtls_ssl_pk_alg_from_sig(uchar sig)

{
  undefined4 local_c;
  uchar sig_local;
  
  if (sig == '\x01') {
    local_c = MBEDTLS_PK_RSA;
  }
  else if (sig == '\x03') {
    local_c = MBEDTLS_PK_ECDSA;
  }
  else {
    local_c = MBEDTLS_PK_NONE;
  }
  return local_c;
}

Assistant:

mbedtls_pk_type_t mbedtls_ssl_pk_alg_from_sig( unsigned char sig )
{
    switch( sig )
    {
#if defined(MBEDTLS_RSA_C)
        case MBEDTLS_SSL_SIG_RSA:
            return( MBEDTLS_PK_RSA );
#endif
#if defined(MBEDTLS_ECDSA_C)
        case MBEDTLS_SSL_SIG_ECDSA:
            return( MBEDTLS_PK_ECDSA );
#endif
        default:
            return( MBEDTLS_PK_NONE );
    }
}